

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_cpputest_malloc_out_of_memory_after_n_mallocs_Test::
~TEST_TestHarness_c_cpputest_malloc_out_of_memory_after_n_mallocs_Test
          (TEST_TestHarness_c_cpputest_malloc_out_of_memory_after_n_mallocs_Test *this)

{
  TEST_TestHarness_c_cpputest_malloc_out_of_memory_after_n_mallocs_Test *this_local;
  
  ~TEST_TestHarness_c_cpputest_malloc_out_of_memory_after_n_mallocs_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestHarness_c, cpputest_malloc_out_of_memory_after_n_mallocs)
{
    cpputest_malloc_set_out_of_memory_countdown(3);
    void * m1 = cpputest_malloc(10);
    void * m2 = cpputest_malloc(11);
    void * m3 = cpputest_malloc(12);
    CHECK(m1 != NULLPTR);
    CHECK(m2 != NULLPTR);
    CHECK(m3 == NULLPTR);
    cpputest_malloc_set_not_out_of_memory();
    cpputest_free(m1);
    cpputest_free(m2);
}